

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_add_constrain_midnode
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  int iVar2;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  REF_NODE ref_node;
  uint uVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  bool bVar6;
  bool bVar7;
  REF_INT ncell;
  REF_INT sense;
  REF_INT cell;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT face_geom;
  REF_BOOL supported;
  REF_DBL param [2];
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_INT cells [2];
  REF_INT nodes [27];
  int local_130;
  REF_INT local_12c;
  undefined8 local_128;
  uint local_120;
  REF_INT local_11c;
  REF_NODE local_118;
  REF_DBL local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  double local_f8;
  double local_f0;
  REF_CELL local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  long local_b8;
  REF_INT local_b0 [32];
  
  local_128 = CONCAT44(in_register_0000000c,new_node);
  ref_geom = ref_grid->geom;
  if ((node0 < 0) || (ref_geom->ref_adj->nnode <= node0)) {
    bVar6 = false;
  }
  else {
    bVar6 = ref_geom->ref_adj->first[(uint)node0] != -1;
  }
  if ((node1 < 0) || (ref_geom->ref_adj->nnode <= node1)) {
    bVar7 = false;
  }
  else {
    bVar7 = ref_geom->ref_adj->first[(uint)node1] != -1;
  }
  if (!(bool)(bVar6 & bVar7)) {
    return 0;
  }
  local_118 = ref_grid->node;
  local_e0 = 1.0 - node1_weight;
  ref_cell = ref_grid->cell[0];
  local_110 = node1_weight;
  local_b0[2] = node0;
  local_b0[3] = node1;
  uVar4 = ref_cell_with(ref_cell,local_b0 + 2,&local_11c);
  local_120 = uVar4;
  if (uVar4 != 5) {
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x55a,
             "ref_geom_add_constrain_midnode",(ulong)uVar4,"search for edg");
      return uVar4;
    }
    uVar4 = ref_cell_nodes(ref_cell,local_11c,local_b0 + 2);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x55b,
             "ref_geom_add_constrain_midnode",(ulong)uVar4,"get id");
      return uVar4;
    }
    RVar1 = local_b0[(long)ref_cell->node_per + 2];
    uVar4 = ref_geom_cell_tuv(ref_geom,node0,local_b0 + 2,1,&local_c8,&local_12c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x55f,
             "ref_geom_add_constrain_midnode",(ulong)uVar4,"cell uv");
      return uVar4;
    }
    uVar4 = ref_geom_cell_tuv(ref_geom,node1,local_b0 + 2,1,&local_d8,&local_12c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x561,
             "ref_geom_add_constrain_midnode",(ulong)uVar4);
      return uVar4;
    }
    local_f8 = local_c8 * local_e0 + local_d8 * local_110;
    uVar4 = ref_egads_eval_at(ref_geom,1,RVar1,&local_f8,local_118->real + (int)local_128 * 0xf,
                              (REF_DBL *)0x0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x565,
             "ref_geom_add_constrain_midnode",(ulong)uVar4,"eval");
      return uVar4;
    }
    uVar4 = ref_geom_add(ref_geom,(REF_INT)local_128,1,RVar1,&local_f8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x566,
             "ref_geom_add_constrain_midnode",(ulong)uVar4,"new geom");
      return uVar4;
    }
  }
  local_e8 = ref_grid->cell[3];
  uVar4 = ref_cell_list_with2(local_e8,node0,node1,2,&local_130,local_b0);
  if (uVar4 == 0) {
    uVar4 = 0;
    if ((long)local_130 != 0) {
      if ((ref_geom->manifold == 0) || (local_130 == 2)) {
        uVar4 = 0;
        if (0 < local_130) {
          local_b8 = (long)((int)local_128 * 0xf) << 3;
          lVar5 = 0;
          do {
            local_11c = local_b0[lVar5];
            uVar4 = ref_cell_nodes(local_e8,local_11c,local_b0 + 2);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x57a,"ref_geom_add_constrain_midnode",(ulong)uVar4,"get id");
              return uVar4;
            }
            uVar4 = ref_geom_tri_supported(ref_geom,local_b0 + 2,&local_fc);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x57c,"ref_geom_add_constrain_midnode",(ulong)uVar4,"tri support");
              return uVar4;
            }
            if (local_fc != 0) {
              RVar1 = local_b0[(long)local_e8->node_per + 2];
              uVar4 = ref_geom_cell_tuv(ref_geom,node0,local_b0 + 2,2,&local_c8,&local_12c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x582,"ref_geom_add_constrain_midnode",(ulong)uVar4,"cell uv");
                return uVar4;
              }
              uVar4 = ref_geom_cell_tuv(ref_geom,node1,local_b0 + 2,2,&local_d8,&local_12c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x584,"ref_geom_add_constrain_midnode",(ulong)uVar4);
                return uVar4;
              }
              local_f8 = local_c8 * local_e0 + local_d8 * local_110;
              local_f0 = local_c0 * local_e0 + local_d0 * local_110;
              uVar4 = ref_geom_add(ref_geom,(REF_INT)local_128,2,RVar1,&local_f8);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x588,"ref_geom_add_constrain_midnode",(ulong)uVar4);
                return uVar4;
              }
              uVar4 = ref_geom_find(ref_geom,(REF_INT)local_128,2,RVar1,&local_100);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x58a,"ref_geom_add_constrain_midnode",(ulong)uVar4);
                return uVar4;
              }
              uVar4 = ref_geom_find(ref_geom,node0,2,RVar1,&local_104);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x58c,"ref_geom_add_constrain_midnode",(ulong)uVar4);
                return uVar4;
              }
              uVar4 = ref_geom_find(ref_geom,node1,2,RVar1,&local_108);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x58d,"ref_geom_add_constrain_midnode",(ulong)uVar4);
                return uVar4;
              }
              pRVar3 = ref_geom->descr;
              iVar2 = pRVar3[(long)local_104 * 6 + 3];
              if ((iVar2 != 0) && (iVar2 == pRVar3[(long)local_108 * 6 + 3])) {
                pRVar3[(long)local_100 * 6 + 3] = iVar2;
              }
              if ((local_120 == 5) &&
                 (uVar4 = ref_egads_eval_at(ref_geom,2,RVar1,&local_f8,
                                            (REF_DBL *)((long)local_118->real + local_b8),
                                            (REF_DBL *)0x0), uVar4 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x596,"ref_geom_add_constrain_midnode",(ulong)uVar4,"eval");
                return uVar4;
              }
            }
            lVar5 = lVar5 + 1;
            uVar4 = 0;
          } while (lVar5 < local_130);
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x576,"ref_geom_add_constrain_midnode","expected two tri for between",2,
               (long)local_130);
        ref_geom_tattle(ref_geom,node0);
        ref_geom_tattle(ref_geom,node1);
        ref_node = local_118;
        ref_node_location(local_118,node0);
        ref_node_location(ref_node,node1);
        uVar4 = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x56c,
           "ref_geom_add_constrain_midnode",(ulong)uVar4,"list");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_midnode(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_DBL node1_weight,
                                                  REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_egads_eval_at(ref_geom, type, id, param,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }
    if (!has_edge_support) {
      RSS(ref_egads_eval_at(ref_geom, type, id, param,
                            ref_node_xyz_ptr(ref_node, new_node), NULL),
          "eval");
    }
  }

  return REF_SUCCESS;
}